

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_annotations_to_the_rescue.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  controller *pcVar2;
  user *__p;
  model *pmVar3;
  gui_view *this;
  renderer *__p_00;
  direct local_7b;
  stack_over_heap local_7a;
  stack local_79;
  string local_78;
  wrapper<std::shared_ptr<timer>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_timer_*>_>
  local_50;
  array_impl<std::shared_ptr<iclient>,_std::shared_ptr<user>,_std::shared_ptr<timer>_> local_48;
  
  if (boost::ext::di::v1_3_0::scopes::singleton::
      scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
      create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
      ::object == '\0') {
    iVar1 = __cxa_guard_acquire(&boost::ext::di::v1_3_0::scopes::singleton::
                                 scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                 ::
                                 create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                 ::object);
    if (iVar1 != 0) {
      pcVar2 = (controller *)operator_new(1);
      if (boost::ext::di::v1_3_0::scopes::singleton::
          scope_impl<model,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
          create_impl<model,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<model,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_1,int>,boost::ext::di::v1_3_0::named<$_2,int>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_na...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
          ::object == '\0') {
        iVar1 = __cxa_guard_acquire(&boost::ext::di::v1_3_0::scopes::singleton::
                                     scope_impl<model,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                     ::
                                     create_impl<model,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<model,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_1,int>,boost::ext::di::v1_3_0::named<$_2,int>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_na...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                     ::object);
        if (iVar1 != 0) {
          local_48.array[0].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT44(local_48.array[0].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._4_4_,6);
          local_78._M_dataplus._M_p._0_4_ = 8;
          pmVar3 = boost::ext::di::v1_3_0::providers::stack_over_heap::
                   get<model,boost::ext::di::v1_3_0::core::successful::wrapper<int,boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::instance,int>>,boost::ext::di::v1_3_0::core::successful::wrapper<int,boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::instance,int>>>
                             ((stack_over_heap *)&local_50,(direct *)&local_7a,(heap *)&local_7b,
                              (wrapper<int,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::instance,_int>_>
                               *)&local_48,
                              (wrapper<int,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::instance,_int>_>
                               *)&local_78);
          std::__shared_ptr<model,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<model,void>
                    ((__shared_ptr<model,(__gnu_cxx::_Lock_policy)2> *)
                     &boost::ext::di::v1_3_0::scopes::singleton::
                      scope_impl<model,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                      create_impl<model,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<model,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_1,int>,boost::ext::di::v1_3_0::named<$_2,int>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_na...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                      ::object,pmVar3);
          __cxa_atexit(std::__shared_ptr<model,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                       &boost::ext::di::v1_3_0::scopes::singleton::
                        scope_impl<model,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                        ::
                        create_impl<model,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<model,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_1,int>,boost::ext::di::v1_3_0::named<$_2,int>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_na...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                        ::object,&__dso_handle);
          __cxa_guard_release(&boost::ext::di::v1_3_0::scopes::singleton::
                               scope_impl<model,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                               ::
                               create_impl<model,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<model,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_1,int>,boost::ext::di::v1_3_0::named<$_2,int>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_na...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                               ::object);
        }
      }
      pmVar3 = boost::ext::di::v1_3_0::scopes::singleton::
               scope_impl<model,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
               create_impl<model,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<model,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<$_1,int>,boost::ext::di::v1_3_0::named<$_2,int>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_na...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
               ::object;
      if (boost::ext::di::v1_3_0::scopes::singleton::
          scope_impl<gui_view,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
          create_impl<gui_view,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<gui_view,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
          ::object == '\0') {
        iVar1 = __cxa_guard_acquire(&boost::ext::di::v1_3_0::scopes::singleton::
                                     scope_impl<gui_view,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                     ::
                                     create_impl<gui_view,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<gui_view,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                     ::object);
        if (iVar1 != 0) {
          this = (gui_view *)operator_new(8);
          local_48.array[0].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(local_48.array + 1);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          local_78.field_2._M_local_buf[0] = '\0';
          local_78.field_2._9_4_ =
               local_48.array[1].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi._1_4_;
          local_78.field_2._13_2_ =
               local_48.array[1].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi._5_2_;
          local_78.field_2._M_local_buf[0xf] =
               local_48.array[1].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi._7_1_;
          local_78._M_string_length = 0;
          local_48.array[0].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_48.array[1].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 0
          ;
          std::__cxx11::string::~string((string *)&local_48);
          if (boost::ext::di::v1_3_0::scopes::singleton::
              scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
              create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost:...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
              ::object == '\0') {
            iVar1 = __cxa_guard_acquire(&boost::ext::di::v1_3_0::scopes::singleton::
                                         scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                         ::
                                         create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost:...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                         ::object);
            if (iVar1 != 0) {
              __p_00 = (renderer *)operator_new(4);
              __p_00->device = 0x7b;
              std::__shared_ptr<renderer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<renderer,void>
                        ((__shared_ptr<renderer,(__gnu_cxx::_Lock_policy)2> *)
                         &boost::ext::di::v1_3_0::scopes::singleton::
                          scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                          ::
                          create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost:...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                          ::object,__p_00);
              __cxa_atexit(std::__shared_ptr<renderer,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                           &boost::ext::di::v1_3_0::scopes::singleton::
                            scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                            ::
                            create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost:...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                            ::object,&__dso_handle);
              __cxa_guard_release(&boost::ext::di::v1_3_0::scopes::singleton::
                                   scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                   ::
                                   create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost:...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                   ::object);
            }
          }
          gui_view::gui_view(this,&local_78,
                             boost::ext::di::v1_3_0::scopes::singleton::
                             scope_impl<renderer,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                             ::
                             create_impl<renderer,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<renderer,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<renderer>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost:...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                             ::object);
          std::__cxx11::string::~string((string *)&local_78);
          std::__shared_ptr<gui_view,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui_view,void>
                    ((__shared_ptr<gui_view,(__gnu_cxx::_Lock_policy)2> *)
                     &boost::ext::di::v1_3_0::scopes::singleton::
                      scope_impl<gui_view,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                      ::
                      create_impl<gui_view,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<gui_view,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                      ::object,this);
          __cxa_atexit(std::__shared_ptr<gui_view,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                       &boost::ext::di::v1_3_0::scopes::singleton::
                        scope_impl<gui_view,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                        ::
                        create_impl<gui_view,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<gui_view,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                        ::object,&__dso_handle);
          __cxa_guard_release(&boost::ext::di::v1_3_0::scopes::singleton::
                               scope_impl<gui_view,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                               ::
                               create_impl<gui_view,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<gui_view,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                               ::object);
        }
      }
      controller::controller
                (pcVar2,pmVar3,
                 boost::ext::di::v1_3_0::scopes::singleton::
                 scope_impl<gui_view,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                 create_impl<gui_view,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<gui_view,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<gui_view>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                 ::object);
      std::__shared_ptr<controller,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<controller,void>
                ((__shared_ptr<controller,(__gnu_cxx::_Lock_policy)2> *)
                 &boost::ext::di::v1_3_0::scopes::singleton::
                  scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                  create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                  ::object,pcVar2);
      __cxa_atexit(std::__shared_ptr<controller,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &boost::ext::di::v1_3_0::scopes::singleton::
                    scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                    ::
                    create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                    ::object,&__dso_handle);
      __cxa_guard_release(&boost::ext::di::v1_3_0::scopes::singleton::
                           scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                           ::
                           create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                           ::object);
    }
  }
  pcVar2 = boost::ext::di::v1_3_0::scopes::singleton::
           scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
           create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
           ::object;
  if (boost::ext::di::v1_3_0::scopes::singleton::
      scope_impl<user,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
      create_impl<user,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<user,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::depe...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
      ::object == '\0') {
    iVar1 = __cxa_guard_acquire(&boost::ext::di::v1_3_0::scopes::singleton::
                                 scope_impl<user,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                 ::
                                 create_impl<user,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<user,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::depe...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                 ::object);
    if (iVar1 != 0) {
      __p = (user *)operator_new(8);
      (__p->super_iclient)._vptr_iclient = (_func_int **)&PTR__iclient_00105cf0;
      std::__shared_ptr<user,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<user,void>
                ((__shared_ptr<user,(__gnu_cxx::_Lock_policy)2> *)
                 boost::ext::di::v1_3_0::scopes::singleton::
                 scope_impl<user,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                 create_impl<user,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<user,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::depe...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                 ::object,__p);
      __cxa_atexit(std::__shared_ptr<user,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   boost::ext::di::v1_3_0::scopes::singleton::
                   scope_impl<user,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                   create_impl<user,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<user,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::depe...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                   ::object,&__dso_handle);
      __cxa_guard_release(&boost::ext::di::v1_3_0::scopes::singleton::
                           scope_impl<user,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                           ::
                           create_impl<user,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<user,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::depe...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
                           ::object);
    }
  }
  local_78._M_dataplus._M_p =
       boost::ext::di::v1_3_0::scopes::singleton::
       scope_impl<user,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
       create_impl<user,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<user,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,timer,timer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::depe...ost::ext::di::v1_3_0::scopes::instance,int,int,$_2,void,boost::ext::di::v1_3_0::core::none>>>const&)
       ::object;
  local_50.wrapper_.object =
       (unique<boost::ext::di::v1_3_0::scopes::unique,_timer_*>)operator_new(8);
  (((timer *)local_50.wrapper_.object)->super_iclient)._vptr_iclient =
       (_func_int **)&PTR__iclient_00105d90;
  boost::ext::di::v1_3_0::providers::stack_over_heap::
  get<boost::ext::di::v1_3_0::core::array_impl<std::shared_ptr<iclient>,std::shared_ptr<user>,std::shared_ptr<timer>>,boost::ext::di::v1_3_0::core::successful::wrapper<std::shared_ptr<user>,boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,user,std::shared_ptr<user>&>>,boost::ext::di::v1_3_0::core::successful::wrapper<std::shared_ptr<timer>,boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,timer*>>>
            (&local_48,&local_7a,&local_7b,&local_79,
             (wrapper<std::shared_ptr<user>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_user,_std::shared_ptr<user>_&>_>
              *)&local_78,&local_50);
  boost::ext::di::v1_3_0::core::
  array<std::vector<std::shared_ptr<iclient>,_std::allocator<std::shared_ptr<iclient>_>_>_(),_user,_timer>
  ::array<0>((array<std::vector<std::shared_ptr<iclient>,_std::allocator<std::shared_ptr<iclient>_>_>_(),_user,_timer>
              *)&local_78,&local_48);
  boost::ext::di::v1_3_0::core::
  array_impl<std::shared_ptr<iclient>,_std::shared_ptr<user>,_std::shared_ptr<timer>_>::~array_impl
            (&local_48);
  local_48.array[0].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78._M_dataplus._M_p;
  local_48.array[0].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
  local_48.array[1].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       local_78.field_2._M_local_buf[0];
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78.field_2._M_allocated_capacity._1_7_ = 0;
  std::vector<std::shared_ptr<iclient>,_std::allocator<std::shared_ptr<iclient>_>_>::~vector
            ((vector<std::shared_ptr<iclient>,_std::allocator<std::shared_ptr<iclient>_>_> *)
             &local_78);
  app::app((app *)&local_78,pcVar2,
           (vector<std::shared_ptr<iclient>,_std::allocator<std::shared_ptr<iclient>_>_> *)&local_48
          );
  std::vector<std::shared_ptr<iclient>,_std::allocator<std::shared_ptr<iclient>_>_>::~vector
            ((vector<std::shared_ptr<iclient>,_std::allocator<std::shared_ptr<iclient>_>_> *)
             &local_48);
  return 0;
}

Assistant:

int main() {
  auto use_gui_view = true;

  // clang-format off
  auto injector = di::make_injector(
    di::bind<iview>().to([&](const auto& injector) -> iview& {
      if (use_gui_view)
        return injector.template create<gui_view&>();
      else
        return injector.template create<text_view&>();
    })
  , di::bind<timer>().in(di::unique) // different per request
  , di::bind<iclient*[]>().to<user, timer>() // bind many clients
  , di::bind<int>().to(42) // renderer device
  , di::bind<int>().to(123) [di::override] // override renderer device
  , di::bind<int>().named(Rows).to(6)
  , di::bind<int>().named(Cols).to(8)
  );
  // clang-format on

  injector.create<app>();
}